

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O0

_Bool Hacl_P256_ecdsa_sign_p256_sha2
                (uint8_t *signature,uint32_t msg_len,uint8_t *msg,uint8_t *private_key,
                uint8_t *nonce)

{
  _Bool _Var1;
  _Bool res;
  uint8_t *mHash32;
  uint8_t mHash [32];
  uint64_t m_q [4];
  uint8_t *nonce_local;
  uint8_t *private_key_local;
  uint8_t *msg_local;
  uint32_t msg_len_local;
  uint8_t *signature_local;
  
  memset(mHash + 0x18,0,0x20);
  memset(&mHash32,0,0x20);
  Hacl_Hash_SHA2_hash_256((uint8_t *)&mHash32,msg,msg_len);
  bn_from_bytes_be4((uint64_t *)(mHash + 0x18),(uint8_t *)&mHash32);
  qmod_short((uint64_t *)(mHash + 0x18),(uint64_t *)(mHash + 0x18));
  _Var1 = ecdsa_sign_msg_as_qelem(signature,(uint64_t *)(mHash + 0x18),private_key,nonce);
  return _Var1;
}

Assistant:

bool
Hacl_P256_ecdsa_sign_p256_sha2(
  uint8_t *signature,
  uint32_t msg_len,
  uint8_t *msg,
  uint8_t *private_key,
  uint8_t *nonce
)
{
  uint64_t m_q[4U] = { 0U };
  uint8_t mHash[32U] = { 0U };
  Hacl_Hash_SHA2_hash_256(mHash, msg, msg_len);
  KRML_MAYBE_UNUSED_VAR(msg_len);
  uint8_t *mHash32 = mHash;
  bn_from_bytes_be4(m_q, mHash32);
  qmod_short(m_q, m_q);
  bool res = ecdsa_sign_msg_as_qelem(signature, m_q, private_key, nonce);
  return res;
}